

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool AppInitBasicSetup(ArgsManager *args,atomic<int> *exit_status)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  bilingual_str *in_RSI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  allocator<char> in_stack_ffffffffffffff97;
  allocator<char> *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = SetupNetworking();
  if (bVar2) {
    registerSignalHandler(in_stack_ffffffffffffff64,(_func_void_int *)in_stack_ffffffffffffff58);
    registerSignalHandler(in_stack_ffffffffffffff64,(_func_void_int *)in_stack_ffffffffffffff58);
    registerSignalHandler(in_stack_ffffffffffffff64,(_func_void_int *)in_stack_ffffffffffffff58);
    signal(0xd,(__sighandler_t)0x1);
    std::set_new_handler(new_handler_terminate);
    bVar3 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Untranslated((string *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    bVar3 = InitError(in_RSI);
    bilingual_str::~bilingual_str(in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff58->original);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitBasicSetup(const ArgsManager& args, std::atomic<int>& exit_status)
{
    // ********************************************************* Step 1: setup
#ifdef _MSC_VER
    // Turn off Microsoft heap dump noise
    _CrtSetReportMode(_CRT_WARN, _CRTDBG_MODE_FILE);
    _CrtSetReportFile(_CRT_WARN, CreateFileA("NUL", GENERIC_WRITE, 0, nullptr, OPEN_EXISTING, 0, 0));
    // Disable confusing "helpful" text message on abort, Ctrl-C
    _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif
#ifdef WIN32
    // Enable heap terminate-on-corruption
    HeapSetInformation(nullptr, HeapEnableTerminationOnCorruption, nullptr, 0);
#endif
    if (!SetupNetworking()) {
        return InitError(Untranslated("Initializing networking failed."));
    }

#ifndef WIN32
    // Clean shutdown on SIGTERM
    registerSignalHandler(SIGTERM, HandleSIGTERM);
    registerSignalHandler(SIGINT, HandleSIGTERM);

    // Reopen debug.log on SIGHUP
    registerSignalHandler(SIGHUP, HandleSIGHUP);

    // Ignore SIGPIPE, otherwise it will bring the daemon down if the client closes unexpectedly
    signal(SIGPIPE, SIG_IGN);
#else
    SetConsoleCtrlHandler(consoleCtrlHandler, true);
#endif

    std::set_new_handler(new_handler_terminate);

    return true;
}